

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *progname_00;
  int iVar1;
  arg_dbl *paVar2;
  arg_int *paVar3;
  arg_lit *paVar4;
  arg_str *paVar5;
  arg_str *paVar6;
  arg_int *paVar7;
  arg_file *paVar8;
  arg_lit *paVar9;
  arg_lit *paVar10;
  arg_file *paVar11;
  arg_file *paVar12;
  arg_file *paVar13;
  time_t tVar14;
  undefined1 local_150 [8];
  AppCtx ctx;
  int32_t iloglvl;
  int nerrors;
  int exitcode;
  void *argtable [13];
  arg_end *end;
  arg_file *json_report_path;
  arg_file *vis_path;
  arg_file *instance;
  arg_lit *version;
  arg_lit *help;
  arg_file *logfile;
  arg_int *loglvl;
  arg_str *solver;
  arg_str *defines;
  arg_lit *treat_sigterm_as_failure;
  arg_int *randomseed;
  arg_dbl *timelimit;
  FILE *log_file_handle;
  char *progname;
  char **argv_local;
  int argc_local;
  
  progname_00 = *argv;
  timelimit = (arg_dbl *)0x0;
  if (argc == 1) {
    print_brief_description(progname_00);
    print_version();
    printf("\n");
    print_use_help_for_more_information(progname_00);
    argv_local._4_4_ = 1;
  }
  else {
    paVar2 = arg_dbl0("t","timelimit",(char *)0x0,
                      "define the maximum timelimit in seconds (default 10 minutes)");
    paVar3 = arg_int0("s","seed",(char *)0x0,
                      "define the random seed to use (default is 0, eg compute it from the current time)"
                     );
    paVar4 = arg_lit0("a","treat-sigterm-as-failure",
                      "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit with non zero exit status. The JSON report output file will not be generated"
                     );
    paVar5 = arg_strn("D","define","KEY=VALUE",0,argc + 2,"define parameters");
    paVar6 = arg_str0("S","solver","SOLVER","solver to use (default \"mip\")");
    paVar7 = arg_int0((char *)0x0,"loglvl",(char *)0x0,
                      "control the log level (0: fatal&warning logs, 1: info logs, 2: trace logs, 3: debug logs (only in debug builds)"
                     );
    paVar8 = arg_file0("l","log",(char *)0x0,
                       "specify an additional file where logs would be stored (default none)");
    paVar9 = arg_lit0((char *)0x0,"help","print this help and exit");
    paVar10 = arg_lit0((char *)0x0,"version","print version information and exit");
    paVar11 = arg_file1("i","instance",(char *)0x0,"input instance file");
    paVar12 = arg_file0((char *)0x0,"visualize",(char *)0x0,"tour visualization output file");
    paVar13 = arg_file0("w","write-report",(char *)0x0,"write a JSON report output file.");
    argtable[0xb] = arg_end(0x10);
    _nerrors = paVar9;
    argtable[0] = paVar10;
    argtable[1] = paVar7;
    argtable[2] = paVar8;
    argtable[3] = paVar4;
    argtable[4] = paVar2;
    argtable[5] = paVar3;
    argtable[6] = paVar5;
    argtable[7] = paVar11;
    argtable[8] = paVar12;
    argtable[9] = paVar13;
    argtable[10] = paVar6;
    argtable[0xc] = argtable[0xb];
    iVar1 = arg_nullcheck((void **)&nerrors);
    if (iVar1 == 0) {
      *paVar2->dval = 600.0;
      *paVar3->ival = 0;
      *paVar6->sval = "mip";
      *paVar8->filename = (char *)0x0;
      *paVar12->filename = (char *)0x0;
      *paVar13->filename = (char *)0x0;
      *paVar7->ival = 0;
      iVar1 = arg_parse(argc,argv,(void **)&nerrors);
      if (paVar9->count < 1) {
        if (iVar1 < 1) {
          if (paVar10->count < 1) {
            if (*paVar7->ival < 1) {
              ctx.json_report_path._4_4_ = 0x40;
            }
            else if (*paVar7->ival == 1) {
              ctx.json_report_path._4_4_ = 0x20;
            }
            else if (*paVar7->ival == 2) {
              ctx.json_report_path._4_4_ = 0;
            }
            else {
              ctx.json_report_path._4_4_ = -0x20;
            }
            log_set_level(ctx.json_report_path._4_4_);
            if (0 < paVar8->count) {
              timelimit = (arg_dbl *)fopen(*paVar8->filename,"w");
              if ((FILE *)timelimit == (FILE *)0x0) {
                fprintf(_stderr,"%s: Failed to open for logging\n",*paVar8->filename);
              }
              else {
                log_add_fp((FILE *)timelimit,ctx.json_report_path._4_4_);
              }
            }
            local_150._0_4_ = ctx.json_report_path._4_4_;
            local_150[4] = 0 < paVar4->count;
            ctx._0_8_ = *paVar11->filename;
            ctx.instance_filepath = *paVar6->sval;
            ctx.solver = (char *)*paVar2->dval;
            ctx.timelimit._0_4_ = *paVar3->ival;
            ctx._32_8_ = paVar5->sval;
            ctx.defines._0_4_ = paVar5->count;
            ctx._48_8_ = *paVar12->filename;
            ctx.vis_path = *paVar13->filename;
            if (ctx.timelimit._0_4_ == 0) {
              tVar14 = time((time_t *)0x0);
              ctx.timelimit._0_4_ = (int)(tVar14 % 0x7fffffff);
            }
            iloglvl = main2((AppCtx *)local_150);
          }
          else {
            print_version();
            iloglvl = 0;
          }
        }
        else {
          arg_print_errors(_stdout,(arg_end *)argtable[0xc],progname_00);
          print_use_help_for_more_information(progname_00);
          iloglvl = 1;
        }
      }
      else {
        print_brief_description(progname_00);
        printf("Usage: %s",progname_00);
        arg_print_syntax(_stdout,(void **)&nerrors,"\n");
        arg_print_glossary(_stdout,(void **)&nerrors,"  %-32s %s\n");
        cptp_print_list_of_solvers_and_params();
        iloglvl = 0;
      }
    }
    else {
      printf("%s: insufficient memory\n",progname_00);
      iloglvl = 1;
    }
    arg_freetable((void **)&nerrors,0xd);
    if (timelimit != (arg_dbl *)0x0) {
      fclose((FILE *)timelimit);
    }
    argv_local._4_4_ = iloglvl;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    const char *progname = argv[0];
    FILE *log_file_handle = NULL;

    if (argc == 1) {
        print_brief_description(progname);
        print_version();
        printf("\n");
        print_use_help_for_more_information(progname);
        return EXIT_FAILURE;
    }

    struct arg_dbl *timelimit = arg_dbl0(
        "t", "timelimit", NULL,
        "define the maximum timelimit in seconds (default 10 minutes)");
    struct arg_int *randomseed =
        arg_int0("s", "seed", NULL,
                 "define the random seed to use (default is 0, eg compute it "
                 "from the current time)");
    struct arg_lit *treat_sigterm_as_failure =
        arg_lit0("a", "treat-sigterm-as-failure",
                 "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit "
                 "with non zero exit status. The JSON report output file will "
                 "not be generated");
    struct arg_str *defines =
        arg_strn("D", "define", "KEY=VALUE", 0, argc + 2, "define parameters");
    struct arg_str *solver =
        arg_str0("S", "solver", "SOLVER", "solver to use (default \"mip\")");
    struct arg_int *loglvl =
        arg_int0(NULL, "loglvl", NULL,
                 "control the log level (0: fatal&warning logs, 1: info logs, "
                 "2: trace logs, 3: debug logs (only in debug builds)");
    struct arg_file *logfile =
        arg_file0("l", "log", NULL,
                  "specify an additional file where logs would be "
                  "stored (default none)");
    struct arg_lit *help = arg_lit0(NULL, "help", "print this help and exit");
    struct arg_lit *version =
        arg_lit0(NULL, "version", "print version information and exit");
    struct arg_file *instance =
        arg_file1("i", "instance", NULL, "input instance file");

    struct arg_file *vis_path =
        arg_file0(NULL, "visualize", NULL, "tour visualization output file");
    struct arg_file *json_report_path = arg_file0(
        "w", "write-report", NULL, "write a JSON report output file.");

    struct arg_end *end = arg_end(MAX_NUMBER_OF_ERRORS_TO_DISPLAY);

    void *argtable[] = {help,
                        version,
                        loglvl,
                        logfile,
                        treat_sigterm_as_failure,
                        timelimit,
                        randomseed,
                        defines,
                        instance,
                        vis_path,
                        json_report_path,
                        solver,
                        end};

    int exitcode = 0;

    /* verify the argtable[] entries were allocated successfully */
    if (arg_nullcheck(argtable) != 0) {
        printf("%s: insufficient memory\n", progname);
        exitcode = 1;
        goto exit;
    }

    // Default time limit
    timelimit->dval[0] = DEFAULT_TIME_LIMIT;
    // Default random seed
    randomseed->ival[0] = 0;
    // Default solver
    solver->sval[0] = "mip";
    // No logging file by default
    logfile->filename[0] = NULL;
    // No tour visualization file by default
    vis_path->filename[0] = NULL;
    // No JSON report output file by default
    json_report_path->filename[0] = NULL;
    // Contain only fatal&warning log messages by default
    loglvl->ival[0] = 0;

    {
        int nerrors = arg_parse(argc, argv, argtable);

        /* special case: '--help' takes precedence over error reporting */
        if (help->count > 0) {
            print_brief_description(progname);
            printf("Usage: %s", progname);
            arg_print_syntax(stdout, argtable, "\n");
            arg_print_glossary(stdout, argtable, "  %-32s %s\n");
            cptp_print_list_of_solvers_and_params();
            exitcode = 0;
            goto exit;
        }

        if (nerrors > 0) {
            arg_print_errors(stdout, end, progname);
            print_use_help_for_more_information(progname);
            exitcode = 1;
            goto exit;
        }
    }

    /* special case: '--version' takes precedence error reporting */
    if (version->count > 0) {
        print_version();
        exitcode = 0;
        goto exit;
    }

    int32_t iloglvl = LOG_WARN;
    if (loglvl->ival[0] <= 0) {
        iloglvl = LOG_WARN;
    } else if (loglvl->ival[0] == 1) {
        iloglvl = LOG_INFO;
    } else if (loglvl->ival[0] == 2) {
        iloglvl = LOG_TRACE;
    } else {
        iloglvl = LOG_DEBUG;
    }

    log_set_level(iloglvl);

    if (logfile->count > 0) {
        log_file_handle = fopen(logfile->filename[0], "w");
        if (log_file_handle) {
            log_add_fp(log_file_handle, iloglvl);
        } else {
            fprintf(stderr, "%s: Failed to open for logging\n",
                    logfile->filename[0]);
        }
    }

    AppCtx ctx = {.loglvl = iloglvl,
                  .instance_filepath = instance->filename[0],
                  .treat_sigterm_as_failure =
                      treat_sigterm_as_failure->count > 0,
                  .solver = solver->sval[0],
                  .timelimit = timelimit->dval[0],
                  .randomseed = randomseed->ival[0],
                  .defines = defines->sval,
                  .num_defines = defines->count,
                  .vis_path = vis_path->filename[0],
                  .json_report_path = json_report_path->filename[0]};

    if (ctx.randomseed == 0) {
        ctx.randomseed = (int32_t)(time(NULL) % INT32_MAX);
    }

    exitcode = main2(&ctx);

exit:
    arg_freetable(argtable, ARRAY_LEN(argtable));

    if (log_file_handle) {
        fclose(log_file_handle);
        log_file_handle = NULL;
    }

    return exitcode;
}